

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O3

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::RenameColumnInfo::Deserialize(RenameColumnInfo *this,Deserializer *deserializer)

{
  uint uVar1;
  RenameColumnInfo *this_00;
  pointer pRVar2;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::RenameColumnInfo_*,_false> local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (RenameColumnInfo *)operator_new(0xb8);
  RenameColumnInfo(this_00);
  local_58._M_head_impl = this_00;
  pRVar2 = unique_ptr<duckdb::RenameColumnInfo,_std::default_delete<duckdb::RenameColumnInfo>,_true>
           ::operator->((unique_ptr<duckdb::RenameColumnInfo,_std::default_delete<duckdb::RenameColumnInfo>,_true>
                         *)&local_58);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,400,"old_name");
  if ((char)uVar1 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pRVar2->old_name,(string *)&local_50);
    if (local_50 != local_40) goto LAB_010a6848;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pRVar2->old_name,(string *)&local_50);
    if (local_50 != local_40) {
LAB_010a6848:
      operator_delete(local_50);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  pRVar2 = unique_ptr<duckdb::RenameColumnInfo,_std::default_delete<duckdb::RenameColumnInfo>,_true>
           ::operator->((unique_ptr<duckdb::RenameColumnInfo,_std::default_delete<duckdb::RenameColumnInfo>,_true>
                         *)&local_58);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x191,"new_name");
  if ((char)uVar1 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pRVar2->new_name,(string *)&local_50);
    if (local_50 == local_40) goto LAB_010a68ec;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pRVar2->new_name,(string *)&local_50);
    if (local_50 == local_40) goto LAB_010a68ec;
  }
  operator_delete(local_50);
LAB_010a68ec:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)this;
}

Assistant:

unique_ptr<AlterTableInfo> RenameColumnInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<RenameColumnInfo>(new RenameColumnInfo());
	deserializer.ReadPropertyWithDefault<string>(400, "old_name", result->old_name);
	deserializer.ReadPropertyWithDefault<string>(401, "new_name", result->new_name);
	return std::move(result);
}